

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O3

void compute_ideal_colors_and_weights_2_comp
               (image_block *blk,partition_info *pi,endpoints_and_weights *ei,int component1,
               int component2)

{
  undefined8 uVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  ulong uVar10;
  float fVar11;
  bool bVar12;
  ulong uVar13;
  uint8_t (*pauVar14) [216];
  uint uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  image_block *piVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  float fVar44;
  float fVar45;
  undefined1 auVar42 [16];
  float fVar46;
  undefined1 auVar43 [16];
  float fVar47;
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  partition_metrics pms [4];
  partition_metrics local_b8 [4];
  
  uVar4 = pi->partition_count;
  (ei->ep).partition_count = (uint)uVar4;
  if (uVar4 == 0) {
    __assert_fail("partition_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                  ,0xe2,
                  "void compute_ideal_colors_and_weights_2_comp(const image_block &, const partition_info &, endpoints_and_weights &, int, int)"
                 );
  }
  bVar2 = blk->texel_count;
  uVar13 = (ulong)bVar2;
  if (bVar2 != 0) {
    piVar21 = blk;
    if (component2 == 1 && component1 == 0) {
      auVar22._0_4_ = (blk->channel_weight).m[0] + 0.0;
      auVar22._4_4_ = (blk->channel_weight).m[1] + 0.0;
      auVar22._8_4_ = (blk->channel_weight).m[2] + 0.0;
      auVar22._12_4_ = (blk->channel_weight).m[3] + 0.0;
      auVar22 = vhaddps_avx(auVar22,auVar22);
      fVar5 = auVar22._0_4_;
      lVar17 = 0x380;
    }
    else if (component2 == 2 && component1 == 0) {
      auVar22 = vpermilps_avx(*(undefined1 (*) [16])(blk->channel_weight).m,0xe8);
      auVar23._0_4_ = auVar22._0_4_ + 0.0;
      auVar23._4_4_ = auVar22._4_4_ + 0.0;
      auVar23._8_4_ = auVar22._8_4_ + 0.0;
      auVar23._12_4_ = auVar22._12_4_ + 0.0;
      auVar22 = vhaddps_avx(auVar23,auVar23);
      fVar5 = auVar22._0_4_;
      lVar17 = 0x700;
    }
    else {
      if ((component1 != 1) || (component2 != 2)) {
        __assert_fail("component1 == 1 && component2 == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                      ,0xfd,
                      "void compute_ideal_colors_and_weights_2_comp(const image_block &, const partition_info &, endpoints_and_weights &, int, int)"
                     );
      }
      auVar22 = vpermilps_avx(*(undefined1 (*) [16])(blk->channel_weight).m,0xe9);
      auVar24._0_4_ = auVar22._0_4_ + 0.0;
      auVar24._4_4_ = auVar22._4_4_ + 0.0;
      auVar24._8_4_ = auVar22._8_4_ + 0.0;
      auVar24._12_4_ = auVar22._12_4_ + 0.0;
      auVar22 = vhaddps_avx(auVar24,auVar24);
      fVar5 = auVar22._0_4_;
      lVar17 = 0x700;
      piVar21 = (image_block *)blk->data_g;
    }
    compute_avgs_and_dirs_2_comp(pi,blk,component1,component2,local_b8);
    auVar25._4_4_ = component1;
    auVar25._0_4_ = component1;
    auVar25._8_4_ = component1;
    auVar25._12_4_ = component1;
    auVar31._4_4_ = component2;
    auVar31._0_4_ = component2;
    auVar31._8_4_ = component2;
    auVar31._12_4_ = component2;
    pauVar14 = pi->texels_of_partition;
    bVar12 = true;
    uVar18 = 0;
    auVar24 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar22 = vpcmpeqd_avx(auVar24,auVar31);
    auVar24 = vpcmpeqd_avx(auVar24,auVar25);
    auVar41._8_4_ = 0x3f800000;
    auVar41._0_8_ = 0x3f8000003f800000;
    auVar41._12_4_ = 0x3f800000;
    fVar47 = 0.0;
    do {
      auVar23 = *(undefined1 (*) [16])local_b8[uVar18].dir.m;
      uVar1 = *(undefined8 *)(local_b8[uVar18].dir.m + 2);
      fVar30 = (float)uVar1;
      auVar32._0_4_ = auVar23._0_4_ + fVar30;
      fVar44 = (float)((ulong)uVar1 >> 0x20);
      auVar32._4_4_ = auVar23._4_4_ + fVar44;
      auVar32._8_4_ = auVar23._8_4_ + fVar30;
      auVar32._12_4_ = auVar23._12_4_ + fVar44;
      auVar25 = vhaddps_avx(auVar32,auVar32);
      if (auVar25._0_4_ < 0.0) {
        auVar23 = vsubps_avx(ZEXT816(0) << 0x20,auVar23);
      }
      auVar33._0_4_ = auVar23._0_4_ * auVar23._0_4_;
      auVar33._4_4_ = auVar23._4_4_ * auVar23._4_4_;
      auVar33._8_4_ = auVar23._8_4_ * auVar23._8_4_;
      auVar33._12_4_ = auVar23._12_4_ * auVar23._12_4_;
      auVar25 = vshufpd_avx(auVar33,auVar33,1);
      auVar34._0_4_ = auVar25._0_4_ + auVar33._0_4_;
      auVar34._4_4_ = auVar25._4_4_ + auVar33._4_4_;
      auVar34._8_4_ = auVar25._8_4_ + auVar33._8_4_;
      auVar34._12_4_ = auVar25._12_4_ + auVar33._12_4_;
      auVar25 = vhaddps_avx(auVar34,auVar34);
      fVar30 = auVar25._0_4_;
      auVar42._4_4_ = fVar30;
      auVar42._0_4_ = fVar30;
      auVar42._8_4_ = fVar30;
      auVar42._12_4_ = fVar30;
      auVar25 = vsqrtps_avx(auVar42);
      auVar23 = vdivps_avx(auVar23,auVar25);
      if ((fVar30 == 0.0) && (!NAN(fVar30))) {
        auVar23 = ZEXT816(0x3f3504f33f3504f3);
      }
      auVar25 = *(undefined1 (*) [16])local_b8[uVar18].avg.m;
      uVar19 = (ulong)pi->partition_texel_count[uVar18];
      auVar31 = SUB6416(ZEXT464(0xd01502f9),0);
      auVar32 = SUB6416(ZEXT464(0x501502f9),0);
      fVar30 = auVar23._0_4_;
      fVar44 = auVar23._4_4_;
      fVar45 = auVar23._8_4_;
      fVar46 = auVar23._12_4_;
      if (uVar19 != 0) {
        uVar20 = 0;
        do {
          uVar10 = (ulong)(*pauVar14)[uVar20];
          auVar23 = vinsertps_avx(ZEXT416((uint)piVar21->data_r[uVar10]),
                                  ZEXT416(*(uint *)((long)blk->data_r + uVar10 * 4 + lVar17)),0x1c);
          auVar23 = vsubps_avx(auVar23,auVar25);
          auVar26._0_4_ = fVar30 * auVar23._0_4_;
          auVar26._4_4_ = fVar44 * auVar23._4_4_;
          auVar26._8_4_ = fVar45 * auVar23._8_4_;
          auVar26._12_4_ = fVar46 * auVar23._12_4_;
          auVar23 = vshufpd_avx(auVar26,auVar26,1);
          auVar27._0_4_ = auVar26._0_4_ + auVar23._0_4_;
          auVar27._4_4_ = auVar26._4_4_ + auVar23._4_4_;
          auVar27._8_4_ = auVar26._8_4_ + auVar23._8_4_;
          auVar27._12_4_ = auVar26._12_4_ + auVar23._12_4_;
          auVar23 = vhaddps_avx(auVar27,auVar27);
          ei->weights[uVar10] = auVar23._0_4_;
          auVar32 = vminss_avx(auVar23,auVar32);
          auVar31 = vmaxss_avx(auVar23,auVar31);
          uVar20 = uVar20 + 1;
        } while (uVar19 != uVar20);
      }
      auVar23 = auVar32;
      if (auVar31._0_4_ <= auVar32._0_4_) {
        auVar23 = ZEXT816(0) << 0x20;
      }
      auVar32 = vcmpss_avx(auVar31,auVar32,6);
      auVar35._8_4_ = 0x33d6bf95;
      auVar35._0_8_ = 0x33d6bf9533d6bf95;
      auVar35._12_4_ = 0x33d6bf95;
      auVar31 = vblendvps_avx(auVar35,auVar31,auVar32);
      fVar49 = auVar23._0_4_;
      fVar50 = auVar31._0_4_;
      fVar7 = fVar50 - fVar49;
      fVar6 = fVar7 * fVar7;
      fVar11 = fVar6;
      if (uVar18 != 0) {
        bVar12 = (bool)(fVar6 == fVar47 & bVar12);
        fVar11 = fVar47;
      }
      fVar47 = fVar11;
      if (uVar19 != 0) {
        fVar6 = fVar6 * fVar5 * 0.5;
        uVar20 = 0;
        do {
          bVar3 = (*pauVar14)[uVar20];
          auVar23 = ZEXT416((uint)((1.0 / fVar7) * (ei->weights[bVar3] - fVar49)));
          auVar31 = vmaxss_avx(auVar23,(undefined1  [16])0x0);
          auVar23 = vcmpss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar23,1);
          auVar23 = vblendvps_avx(auVar31,auVar41,auVar23);
          ei->weights[bVar3] = auVar23._0_4_;
          ei->weight_error_scale[bVar3] = fVar6;
          if (NAN(fVar6)) {
            __assert_fail("!astc::isnan(ei.weight_error_scale[tix])",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                          ,0x142,
                          "void compute_ideal_colors_and_weights_2_comp(const image_block &, const partition_info &, endpoints_and_weights &, int, int)"
                         );
          }
          uVar20 = uVar20 + 1;
        } while (uVar19 != uVar20);
      }
      auVar28._0_4_ = auVar25._0_4_ + fVar30 * fVar49;
      auVar28._4_4_ = auVar25._4_4_ + fVar44 * fVar49;
      auVar28._8_4_ = auVar25._8_4_ + fVar45 * fVar49;
      auVar28._12_4_ = auVar25._12_4_ + fVar46 * fVar49;
      auVar36._0_4_ = auVar25._0_4_ + fVar30 * fVar50;
      auVar36._4_4_ = auVar25._4_4_ + fVar44 * fVar50;
      auVar36._8_4_ = auVar25._8_4_ + fVar45 * fVar50;
      auVar36._12_4_ = auVar25._12_4_ + fVar46 * fVar50;
      auVar43._4_4_ = auVar28._0_4_;
      auVar43._0_4_ = auVar28._0_4_;
      auVar43._8_4_ = auVar28._0_4_;
      auVar43._12_4_ = auVar28._0_4_;
      auVar23 = vblendvps_avx(*(undefined1 (*) [16])(blk->data_min).m,auVar43,auVar24);
      auVar48._4_4_ = auVar36._0_4_;
      auVar48._0_4_ = auVar36._0_4_;
      auVar48._8_4_ = auVar36._0_4_;
      auVar48._12_4_ = auVar36._0_4_;
      auVar25 = vblendvps_avx(*(undefined1 (*) [16])(blk->data_max).m,auVar48,auVar24);
      auVar31 = vshufps_avx(auVar28,auVar28,0x55);
      auVar23 = vblendvps_avx(auVar23,auVar31,auVar22);
      *(undefined1 (*) [16])(ei->ep).endpt0[uVar18].m = auVar23;
      auVar23 = vshufps_avx(auVar36,auVar36,0x55);
      auVar23 = vblendvps_avx(auVar25,auVar23,auVar22);
      *(undefined1 (*) [16])(ei->ep).endpt1[uVar18].m = auVar23;
      uVar18 = uVar18 + 1;
      pauVar14 = pauVar14 + 1;
    } while (uVar18 != uVar4);
    uVar15 = bVar2 + 7 & 0xfffffff8;
    if (bVar2 < uVar15) {
      lVar17 = uVar15 - uVar13;
      lVar16 = lVar17 + -1;
      auVar37._8_8_ = lVar16;
      auVar37._0_8_ = lVar16;
      auVar37._16_8_ = lVar16;
      auVar37._24_8_ = lVar16;
      uVar18 = 0;
      auVar8 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar29._8_8_ = 0x8000000000000000;
      auVar29._0_8_ = 0x8000000000000000;
      auVar29._16_8_ = 0x8000000000000000;
      auVar29._24_8_ = 0x8000000000000000;
      auVar9 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar38 = SUB6432(ZEXT464(0xd01502f9),0);
      auVar38 = vpcmpeqd_avx2(auVar38,auVar38);
      do {
        auVar39._8_8_ = uVar18;
        auVar39._0_8_ = uVar18;
        auVar39._16_8_ = uVar18;
        auVar39._24_8_ = uVar18;
        auVar40 = vpor_avx2(auVar39,auVar8);
        auVar39 = vpor_avx2(auVar39,auVar9);
        auVar39 = vpcmpgtq_avx2(auVar39 ^ auVar29,auVar37 ^ auVar29);
        auVar40 = vpcmpgtq_avx2(auVar40 ^ auVar29,auVar37 ^ auVar29);
        auVar39 = vpackssdw_avx2(auVar40,auVar39);
        auVar22 = vpackssdw_avx(SUB3216(auVar39 ^ auVar38,0),SUB3216(auVar39 ^ auVar38,0x10));
        auVar22 = vpshufd_avx(auVar22,0xd8);
        auVar39 = vpmovzxwd_avx2(auVar22);
        auVar40 = vpslld_avx2(auVar39,0x1f);
        auVar39 = vmaskmovps_avx(auVar40,ZEXT1632(ZEXT816(0) << 0x40));
        *(undefined1 (*) [32])(ei->weights + uVar13 + uVar18) = auVar39;
        auVar39 = vmaskmovps_avx(auVar40,ZEXT1632(ZEXT816(0) << 0x40));
        *(undefined1 (*) [32])(ei->weight_error_scale + uVar13 + uVar18) = auVar39;
        uVar18 = uVar18 + 8;
      } while ((lVar17 + 7U & 0xfffffffffffffff8) != uVar18);
    }
    ei->is_constant_weight_error_scale = bVar12;
    return;
  }
  __assert_fail("texel_count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                ,0xe5,
                "void compute_ideal_colors_and_weights_2_comp(const image_block &, const partition_info &, endpoints_and_weights &, int, int)"
               );
}

Assistant:

static void compute_ideal_colors_and_weights_2_comp(
	const image_block& blk,
	const partition_info& pi,
	endpoints_and_weights& ei,
	int component1,
	int component2
) {
	unsigned int partition_count = pi.partition_count;
	ei.ep.partition_count = partition_count;
	promise(partition_count > 0);

	unsigned int texel_count = blk.texel_count;
	promise(texel_count > 0);

	partition_metrics pms[BLOCK_MAX_PARTITIONS];

	float error_weight;
	const float* data_vr = nullptr;
	const float* data_vg = nullptr;

	if (component1 == 0 && component2 == 1)
	{
		error_weight = hadd_s(blk.channel_weight.swz<0, 1>()) / 2.0f;

		data_vr = blk.data_r;
		data_vg = blk.data_g;
	}
	else if (component1 == 0 && component2 == 2)
	{
		error_weight = hadd_s(blk.channel_weight.swz<0, 2>()) / 2.0f;

		data_vr = blk.data_r;
		data_vg = blk.data_b;
	}
	else // (component1 == 1 && component2 == 2)
	{
		assert(component1 == 1 && component2 == 2);

		error_weight = hadd_s(blk.channel_weight.swz<1, 2>()) / 2.0f;

		data_vr = blk.data_g;
		data_vg = blk.data_b;
	}

	compute_avgs_and_dirs_2_comp(pi, blk, component1, component2, pms);

	bool is_constant_wes { true };
	float partition0_len_sq { 0.0f };

	vmask4 comp1_mask = vint4::lane_id() == vint4(component1);
	vmask4 comp2_mask = vint4::lane_id() == vint4(component2);

	for (unsigned int i = 0; i < partition_count; i++)
	{
		vfloat4 dir = pms[i].dir;
		if (hadd_s(dir) < 0.0f)
		{
			dir = vfloat4::zero() - dir;
		}

		line2 line { pms[i].avg, normalize_safe(dir, unit2()) };
		float lowparam { 1e10f };
		float highparam { -1e10f };

		unsigned int partition_texel_count = pi.partition_texel_count[i];
		for (unsigned int j = 0; j < partition_texel_count; j++)
		{
			unsigned int tix = pi.texels_of_partition[i][j];
			vfloat4 point = vfloat2(data_vr[tix], data_vg[tix]);
			float param = dot_s(point - line.a, line.b);
			ei.weights[tix] = param;

			lowparam = astc::min(param, lowparam);
			highparam = astc::max(param, highparam);
		}

		// It is possible for a uniform-color partition to produce length=0;
		// this causes NaN issues so set to small value to avoid this problem
		if (highparam <= lowparam)
		{
			lowparam = 0.0f;
			highparam = 1e-7f;
		}

		float length = highparam - lowparam;
		float length_squared = length * length;
		float scale = 1.0f / length;

		if (i == 0)
		{
			partition0_len_sq = length_squared;
		}
		else
		{
			is_constant_wes = is_constant_wes && length_squared == partition0_len_sq;
		}

		for (unsigned int j = 0; j < partition_texel_count; j++)
		{
			unsigned int tix = pi.texels_of_partition[i][j];
			float idx = (ei.weights[tix] - lowparam) * scale;
			idx = astc::clamp1f(idx);

			ei.weights[tix] = idx;
			ei.weight_error_scale[tix] = length_squared * error_weight;
			assert(!astc::isnan(ei.weight_error_scale[tix]));
		}

		vfloat4 lowvalue = line.a + line.b * lowparam;
		vfloat4 highvalue = line.a + line.b * highparam;

		vfloat4 ep0 = select(blk.data_min, vfloat4(lowvalue.lane<0>()), comp1_mask);
		vfloat4 ep1 = select(blk.data_max, vfloat4(highvalue.lane<0>()), comp1_mask);

		ei.ep.endpt0[i] = select(ep0, vfloat4(lowvalue.lane<1>()), comp2_mask);
		ei.ep.endpt1[i] = select(ep1, vfloat4(highvalue.lane<1>()), comp2_mask);
	}

	// Zero initialize any SIMD over-fetch
	unsigned int texel_count_simd = round_up_to_simd_multiple_vla(texel_count);
	for (unsigned int i = texel_count; i < texel_count_simd; i++)
	{
		ei.weights[i] = 0.0f;
		ei.weight_error_scale[i] = 0.0f;
	}

	ei.is_constant_weight_error_scale = is_constant_wes;
}